

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall
Parsing::Parser::checkHeaders
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  pointer pbVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file;
  File f;
  string local_b0;
  File local_90;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rsrc/header.txt","");
  File::File(&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar9 = false;
  iVar4 = access(local_90._path._M_dataplus._M_p,0);
  if (iVar4 != -1) {
    File::getContent_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_b0,&local_90);
    _Var3._M_p = local_b0._M_dataplus._M_p;
    uVar7 = (long)(local_b0._M_string_length - (long)local_b0._M_dataplus._M_p) >> 5;
    pbVar1 = (v->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(v->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (uVar7 < uVar5) {
      if ((pointer)local_b0._M_string_length != local_b0._M_dataplus._M_p) {
        lVar8 = uVar7 + (uVar7 == 0);
        lVar6 = 8;
        do {
          sVar2 = *(size_t *)(_Var3._M_p + lVar6);
          if ((sVar2 != *(size_t *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6)) ||
             ((sVar2 != 0 &&
              (iVar4 = bcmp(*(void **)(_Var3._M_p + lVar6 + -8),
                            *(void **)((long)pbVar1 + lVar6 + -8),sVar2), iVar4 != 0))))
          goto LAB_00105e54;
          lVar6 = lVar6 + 0x20;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      lVar6 = uVar7 - 1;
      bVar9 = lVar6 == 0;
      if (!bVar9) {
        lVar8 = -0x18;
        do {
          sVar2 = *(size_t *)(_Var3._M_p + lVar8 + uVar7 * 0x20);
          if ((sVar2 != *(size_t *)((long)&pbVar1[uVar5]._M_dataplus._M_p + lVar8)) ||
             ((sVar2 != 0 &&
              (iVar4 = bcmp(*(void **)(_Var3._M_p + lVar8 + uVar7 * 0x20 + -8),
                            *(void **)((long)pbVar1 + lVar8 + uVar5 * 0x20 + -8),sVar2), iVar4 != 0)
              ))) goto LAB_00105e54;
          lVar8 = lVar8 + -0x20;
          lVar6 = lVar6 + -1;
          bVar9 = lVar6 == 0;
        } while (!bVar9);
      }
    }
    else {
LAB_00105e54:
      bVar9 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b0);
  }
  File::~File(&local_90);
  return bVar9;
}

Assistant:

bool Parser::checkHeaders(const std::vector<std::string> &v)
    {
        Parsing::File f("rsrc/header.txt");

        if (!f.isFile())
            return false;

        std::vector<std::string> file = f.getContent();

        if (file.size() >= v.size())
            return false;

        for (size_t it = 0; it < file.size(); it++)
            if (file[it] != v[it])
                return false;

        size_t f_it = file.size() - 1;
        size_t v_it = v.size() - 1;

        while (f_it > 0)
            if (file[f_it--] != v[v_it--])
                return false;
        return true;
    }